

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O3

uint HIST_count_simple(uint *count,uint *maxSymbolValuePtr,void *src,size_t srcSize)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  pbVar1 = (byte *)((long)src + srcSize);
  uVar3 = *maxSymbolValuePtr;
  uVar5 = 0;
  memset(count,0,(ulong)(uVar3 + 1) << 2);
  if (srcSize == 0) {
    *maxSymbolValuePtr = 0;
  }
  else {
    if (0 < (long)srcSize) {
      do {
        bVar2 = *src;
        src = (void *)((long)src + 1);
        count[bVar2] = count[bVar2] + 1;
      } while (src < pbVar1);
    }
    do {
      uVar6 = uVar3;
      uVar3 = uVar6 - 1;
    } while (count[uVar6] == 0);
    *maxSymbolValuePtr = uVar6;
    uVar5 = 0;
    uVar4 = 0xffffffffffffffff;
    do {
      if (uVar5 < count[uVar4 + 1]) {
        uVar5 = count[uVar4 + 1];
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar6);
  }
  return uVar5;
}

Assistant:

unsigned HIST_count_simple(unsigned* count, unsigned* maxSymbolValuePtr,
                           const void* src, size_t srcSize)
{
    const BYTE* ip = (const BYTE*)src;
    const BYTE* const end = ip + srcSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned largestCount=0;

    ZSTD_memset(count, 0, (maxSymbolValue+1) * sizeof(*count));
    if (srcSize==0) { *maxSymbolValuePtr = 0; return 0; }

    while (ip<end) {
        assert(*ip <= maxSymbolValue);
        count[*ip++]++;
    }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;

    {   U32 s;
        for (s=0; s<=maxSymbolValue; s++)
            if (count[s] > largestCount) largestCount = count[s];
    }

    return largestCount;
}